

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

Expression *
slang::ast::MemberAccessExpression::fromSelector
          (Compilation *compilation,Expression *expr,MemberSelector *selector,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context,bool isFromLookupChain)

{
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  SourceRange range_04;
  basic_string_view<char,_std::char_traits<char>_> __y;
  SourceRange sourceRange;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view arg;
  string_view arg_00;
  string_view name;
  string_view methodName;
  SourceRange range_05;
  optional<slang::SourceRange> sourceRange_00;
  optional<slang::SourceRange> sourceRange_01;
  bool bVar1;
  SourceLocation startLoc;
  SourceLocation endLoc;
  NamedValueExpression *pNVar2;
  Type *pTVar3;
  Symbol *pSVar4;
  Expression *pEVar5;
  InvocationExpressionSyntax *syntax;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  Compilation *in_RSI;
  Compilation *in_RDI;
  Expression *in_R8;
  Compilation *in_R9;
  byte in_stack_00000008;
  bool in_stack_00000036;
  bool in_stack_00000037;
  HierarchicalReference *in_stack_00000038;
  Symbol *in_stack_00000040;
  ASTContext *in_stack_00000048;
  SourceRange in_stack_00000050;
  Diagnostic *diag_2;
  ValueSymbol *value;
  SubroutineSymbol *sub;
  ClassPropertySymbol *prop;
  FieldSymbol *field;
  Diagnostic *diag_1;
  Expression *result_3;
  Symbol *member;
  Diagnostic *diag;
  Expression *result_2;
  Symbol *sym_1;
  Expression *result_1;
  Type *base;
  ClassType *ct;
  Scope *scope;
  Type *type;
  anon_class_16_2_15dbab97 errorIfAssertion;
  anon_class_16_2_15dbab97 errorIfNotProcedural;
  Expression *result;
  IteratorSymbol *iter;
  SymbolKind symKind;
  ValueSymbol *sym;
  SourceRange range;
  Expression *in_stack_fffffffffffffc48;
  Compilation *in_stack_fffffffffffffc50;
  SourceLocation in_stack_fffffffffffffc58;
  SourceLocation in_stack_fffffffffffffc60;
  SourceLocation in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 uVar6;
  DiagCode in_stack_fffffffffffffc74;
  undefined4 uVar7;
  SourceLocation in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  DiagCode in_stack_fffffffffffffc84;
  bool local_371;
  Diagnostic *in_stack_fffffffffffffc90;
  Type *in_stack_fffffffffffffc98;
  Diagnostic *in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  InvocationExpressionSyntax *in_stack_fffffffffffffcb0;
  Expression *in_stack_fffffffffffffcb8;
  Expression *in_stack_fffffffffffffcc0;
  Compilation *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  char *in_stack_fffffffffffffcd8;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_fffffffffffffcf0;
  ASTContext *in_stack_fffffffffffffcf8;
  ASTContext *in_stack_fffffffffffffd20;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_fffffffffffffd28;
  Compilation *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  SymbolKind in_stack_fffffffffffffd44;
  SymbolKind SVar8;
  Compilation *in_stack_fffffffffffffd48;
  bitmask<slang::ast::MethodFlags> local_1fa;
  SubroutineSymbol *local_1f8;
  Expression *local_1f0;
  Compilation *local_1e8;
  ClassPropertySymbol *local_1d8;
  Expression *local_1d0;
  Compilation *local_1c8;
  FieldSymbol *local_1b8;
  size_t local_1b0;
  char *local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  ASTContext *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  InvocationExpressionSyntax *in_stack_fffffffffffffe80;
  Expression *in_stack_fffffffffffffe88;
  Subroutine *subroutine;
  Compilation *compilation_00;
  SourceLocation in_stack_fffffffffffffeb0;
  SourceLocation in_stack_fffffffffffffeb8;
  ASTContext *in_stack_fffffffffffffef0;
  Type *in_stack_fffffffffffffef8;
  Compilation *pCVar9;
  SourceRange *pSVar10;
  SourceRange local_50;
  byte local_39;
  Compilation *local_38;
  Expression *local_30;
  basic_string_view<char,_std::char_traits<char>_> *local_20;
  Compilation *local_18;
  Compilation *local_10;
  MemberAccessExpression *local_8;
  
  local_39 = in_stack_00000008 & 1;
  local_38 = in_R9;
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(in_RDX);
  if (bVar1) {
    pEVar5 = Expression::badExpr(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    return pEVar5;
  }
  startLoc = SourceRange::start((SourceRange *)&(local_18->options).maxConstexprDepth);
  endLoc = SourceRange::end((SourceRange *)&local_20[1]._M_str);
  SourceRange::SourceRange(&local_50,startLoc,endLoc);
  if (*(int *)&(local_18->super_BumpAllocator).head == 8) {
    pNVar2 = Expression::as<slang::ast::NamedValueExpression>((Expression *)local_18);
    SVar8 = (((pNVar2->super_ValueExpressionBase).symbol)->super_Symbol).kind;
    if (SVar8 == Iterator) {
      Symbol::as<slang::ast::IteratorSymbol>((Symbol *)0xf5f3e1);
      __x._M_str._0_4_ = in_stack_fffffffffffffc80;
      __x._M_len = (size_t)in_stack_fffffffffffffc78;
      __x._M_str._4_4_ = in_stack_fffffffffffffc84;
      __y._M_str._0_4_ = in_stack_fffffffffffffc70;
      __y._M_len = (size_t)in_stack_fffffffffffffc68;
      __y._M_str._4_4_ = in_stack_fffffffffffffc74;
      bVar1 = std::operator==(__x,__y);
      if (bVar1) {
        in_stack_fffffffffffffd38 = local_10;
        in_stack_fffffffffffffd48 = local_18;
        ::sv((char *)in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
        methodName._M_len._4_4_ = in_stack_fffffffffffffcd4;
        methodName._M_len._0_4_ = in_stack_fffffffffffffcd0;
        methodName._M_str = in_stack_fffffffffffffcd8;
        in_stack_fffffffffffffc50 = local_38;
        pEVar5 = CallExpression::fromBuiltInMethod
                           (in_stack_fffffffffffffcc8,
                            (SymbolKind)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
                            in_stack_fffffffffffffcb8,methodName,in_stack_fffffffffffffcb0,
                            in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffc48 = local_30;
        in_stack_fffffffffffffd44 = SVar8;
        if (pEVar5 != (Expression *)0x0) {
          return pEVar5;
        }
      }
    }
  }
  else if ((*(int *)&(local_18->super_BumpAllocator).head == 0x15) && ((local_39 & 1) != 0)) {
    sourceRange.startLoc._4_2_ = in_stack_fffffffffffffc74.subsystem;
    sourceRange.startLoc._6_2_ = in_stack_fffffffffffffc74.code;
    sourceRange.startLoc._0_4_ = in_stack_fffffffffffffc70;
    sourceRange.endLoc = in_stack_fffffffffffffc78;
    ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc84,
                        sourceRange);
  }
  pSVar10 = &local_50;
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xf5f5df);
  pTVar3 = Type::getCanonicalType((Type *)in_stack_fffffffffffffc50);
  syntax = (InvocationExpressionSyntax *)(ulong)((pTVar3->super_Symbol).kind - EnumType);
  switch(syntax) {
  case (InvocationExpressionSyntax *)0x0:
  case (InvocationExpressionSyntax *)0x3:
  case (InvocationExpressionSyntax *)0x4:
  case (InvocationExpressionSyntax *)0x6:
  case (InvocationExpressionSyntax *)0x7:
  case (InvocationExpressionSyntax *)0x11:
  case (InvocationExpressionSyntax *)0x12:
  case (InvocationExpressionSyntax *)0x16:
    pEVar5 = tryBindSpecialMethod
                       (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                        (MemberSelector *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                        (ArrayOrRandomizeMethodExpressionSyntax *)
                        CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                        (ASTContext *)in_stack_fffffffffffffca0);
    if (pEVar5 != (Expression *)0x0) {
      return pEVar5;
    }
    pEVar5 = CallExpression::fromSystemMethod
                       (in_stack_fffffffffffffd48,
                        (Expression *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                        (MemberSelector *)in_stack_fffffffffffffd38,syntax,in_stack_fffffffffffffd28
                        ,in_stack_fffffffffffffd20);
    return pEVar5;
  case (InvocationExpressionSyntax *)0x8:
  case (InvocationExpressionSyntax *)0x9:
  case (InvocationExpressionSyntax *)0xa:
  case (InvocationExpressionSyntax *)0xb:
    Symbol::as<slang::ast::Scope>((Symbol *)0xf5f640);
    pCVar9 = local_38;
    break;
  case (InvocationExpressionSyntax *)0xc:
    Symbol::as<slang::ast::ClassType>((Symbol *)0xf5f65a);
    in_stack_fffffffffffffef8 = ClassType::getBaseClass((ClassType *)in_stack_fffffffffffffc50);
    pCVar9 = local_38;
    if ((in_stack_fffffffffffffef8 != (Type *)0x0) &&
       (bVar1 = Type::isError((Type *)0xf5f68f), pCVar9 = local_38, bVar1)) {
      pEVar5 = Expression::badExpr(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      return pEVar5;
    }
    break;
  case (InvocationExpressionSyntax *)0xd:
    Symbol::as<slang::ast::CovergroupType>((Symbol *)0xf5f70d);
    CovergroupType::getBody((CovergroupType *)in_stack_fffffffffffffc50);
    pCVar9 = local_38;
    break;
  case (InvocationExpressionSyntax *)0xe:
    pSVar4 = Expression::getSymbolReference
                       ((Expression *)in_stack_fffffffffffffc98,
                        SUB81((ulong)in_stack_fffffffffffffc90 >> 0x38,0));
    if (pSVar4 != (Symbol *)0x0) {
      if (pSVar4->kind == Coverpoint) {
        Symbol::as<slang::ast::CoverpointSymbol>((Symbol *)0xf5f85d);
        pCVar9 = local_38;
      }
      else {
        if (pSVar4->kind != CoverCross) goto switchD_00f5f631_caseD_1;
        Symbol::as<slang::ast::CoverCrossSymbol>((Symbol *)0xf5f8bb);
        pCVar9 = local_38;
      }
      break;
    }
  default:
switchD_00f5f631_caseD_1:
    pEVar5 = tryBindSpecialMethod
                       (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                        (MemberSelector *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                        (ArrayOrRandomizeMethodExpressionSyntax *)
                        CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                        (ASTContext *)in_stack_fffffffffffffca0);
    if (pEVar5 != (Expression *)0x0) {
      return pEVar5;
    }
    ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc74,
                        in_stack_fffffffffffffc68);
    range_00.endLoc = in_stack_fffffffffffffc60;
    range_00.startLoc = in_stack_fffffffffffffc58;
    Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc50,range_00);
    range_01.endLoc = in_stack_fffffffffffffc60;
    range_01.startLoc = in_stack_fffffffffffffc58;
    Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc50,range_01);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xf5fa42);
    ast::operator<<(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    pEVar5 = Expression::badExpr(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    return pEVar5;
  case (InvocationExpressionSyntax *)0x1a:
    pEVar5 = Expression::badExpr(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    return pEVar5;
  }
  subroutine = (Subroutine *)local_20->_M_len;
  compilation_00 = (Compilation *)local_20->_M_str;
  name._M_str = (char *)in_stack_fffffffffffffcb8;
  name._M_len = (size_t)in_stack_fffffffffffffcb0;
  pSVar4 = Scope::find((Scope *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),name);
  if (pSVar4 == (Symbol *)0x0) {
    local_8 = (MemberAccessExpression *)
              tryBindSpecialMethod
                        (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                         (MemberSelector *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                         (ArrayOrRandomizeMethodExpressionSyntax *)
                         CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                         (ASTContext *)in_stack_fffffffffffffca0);
    if (local_8 == (MemberAccessExpression *)0x0) {
      SourceRange::start((SourceRange *)&local_20[1]._M_str);
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc74,
                          in_stack_fffffffffffffc68);
      local_1a0._0_4_ = (local_18->options).maxConstexprDepth;
      local_1a0._4_4_ = (local_18->options).maxConstexprSteps;
      local_198._0_4_ = (local_18->options).maxConstexprBacktrace;
      local_198._4_4_ = (local_18->options).maxDefParamSteps;
      range_02.endLoc = in_stack_fffffffffffffc60;
      range_02.startLoc = in_stack_fffffffffffffc58;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc50,range_02);
      local_1b0 = local_20->_M_len;
      local_1a8 = local_20->_M_str;
      arg._M_str = (char *)in_stack_fffffffffffffca0;
      arg._M_len = (size_t)in_stack_fffffffffffffc98;
      Diagnostic::operator<<(in_stack_fffffffffffffc90,arg);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xf5fc18);
      ast::operator<<(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      local_8 = (MemberAccessExpression *)
                Expression::badExpr(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    }
  }
  else {
    SVar8 = pSVar4->kind;
    if (SVar8 == EnumValue) {
      local_8 = (MemberAccessExpression *)
                ValueExpressionBase::fromSymbol
                          (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000050,
                           in_stack_00000037,in_stack_00000036);
    }
    else if (SVar8 == Field) {
      local_1b8 = Symbol::as<slang::ast::FieldSymbol>((Symbol *)0xf5fce1);
      ValueSymbol::getType((ValueSymbol *)0xf5fd06);
      local_8 = BumpAllocator::
                emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::FieldSymbol_const&,slang::SourceRange&>
                          ((BumpAllocator *)
                           CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                           (Type *)in_stack_fffffffffffffc78,
                           (Expression *)
                           CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                           (FieldSymbol *)in_stack_fffffffffffffc68,
                           (SourceRange *)in_stack_fffffffffffffc60);
    }
    else if (SVar8 == ClassProperty) {
      std::optional<slang::SourceRange>::optional<const_slang::SourceRange_&,_true>
                ((optional<slang::SourceRange> *)in_stack_fffffffffffffc50,
                 (SourceRange *)in_stack_fffffffffffffc48);
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           (SourceLocation)pCVar9;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           (SourceLocation)pTVar3;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._16_8_ = pSVar10;
      Lookup::ensureVisible
                (&in_stack_fffffffffffffef8->super_Symbol,in_stack_fffffffffffffef0,sourceRange_00);
      local_1d8 = Symbol::as<slang::ast::ClassPropertySymbol>((Symbol *)0xf5fdab);
      if (((local_1d8->super_VariableSymbol).lifetime == Automatic) &&
         ((bVar1 = fromSelector::anon_class_16_2_15dbab97::operator()
                             ((anon_class_16_2_15dbab97 *)in_stack_fffffffffffffc78), bVar1 ||
          (bVar1 = fromSelector::anon_class_16_2_15dbab97::operator()
                             ((anon_class_16_2_15dbab97 *)in_stack_fffffffffffffc78), bVar1)))) {
        local_8 = (MemberAccessExpression *)Expression::badExpr(local_1c8,local_1d0);
      }
      else {
        ValueSymbol::getType((ValueSymbol *)0xf5fe24);
        local_8 = BumpAllocator::
                  emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::ClassPropertySymbol_const&,slang::SourceRange&>
                            ((BumpAllocator *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             (Type *)in_stack_fffffffffffffc78,
                             (Expression *)
                             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                             (ClassPropertySymbol *)in_stack_fffffffffffffc68,
                             (SourceRange *)in_stack_fffffffffffffc60);
      }
    }
    else if (SVar8 == Subroutine) {
      std::optional<slang::SourceRange>::optional<const_slang::SourceRange_&,_true>
                ((optional<slang::SourceRange> *)in_stack_fffffffffffffc50,
                 (SourceRange *)in_stack_fffffffffffffc48);
      sourceRange_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           (SourceLocation)pCVar9;
      sourceRange_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           (SourceLocation)pTVar3;
      sourceRange_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._16_8_ = pSVar10;
      Lookup::ensureVisible
                (&in_stack_fffffffffffffef8->super_Symbol,in_stack_fffffffffffffef0,sourceRange_01);
      local_1f8 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0xf5fec6);
      bitmask<slang::ast::MethodFlags>::bitmask(&local_1fa,Static);
      bVar1 = bitmask<slang::ast::MethodFlags>::has
                        ((bitmask<slang::ast::MethodFlags> *)local_1e8,
                         (bitmask<slang::ast::MethodFlags> *)local_1f0);
      local_371 = false;
      if (!bVar1) {
        bVar1 = fromSelector::anon_class_16_2_15dbab97::operator()
                          ((anon_class_16_2_15dbab97 *)in_stack_fffffffffffffc78);
        local_371 = true;
        if (!bVar1) {
          local_371 = fromSelector::anon_class_16_2_15dbab97::operator()
                                ((anon_class_16_2_15dbab97 *)in_stack_fffffffffffffc78);
        }
      }
      if (local_371 == false) {
        std::variant<slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
        ::
        variant<slang::ast::SubroutineSymbol_const*,void,void,slang::ast::SubroutineSymbol_const*,void>
                  ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                    *)local_1e8,(SubroutineSymbol **)local_1f0);
        range_05.endLoc = in_stack_fffffffffffffeb8;
        range_05.startLoc = in_stack_fffffffffffffeb0;
        local_8 = (MemberAccessExpression *)
                  CallExpression::fromLookup
                            (compilation_00,subroutine,in_stack_fffffffffffffe88,
                             in_stack_fffffffffffffe80,
                             (ArrayOrRandomizeMethodExpressionSyntax *)
                             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),range_05,
                             in_stack_fffffffffffffe70);
      }
      else {
        local_8 = (MemberAccessExpression *)Expression::badExpr(local_1e8,local_1f0);
      }
    }
    else if (((SVar8 == ConstraintBlock) || (SVar8 - Coverpoint < 2)) || (SVar8 == CoverageBin)) {
      bVar1 = fromSelector::anon_class_16_2_15dbab97::operator()
                        ((anon_class_16_2_15dbab97 *)in_stack_fffffffffffffc78);
      if (bVar1) {
        local_8 = (MemberAccessExpression *)
                  Expression::badExpr(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      }
      else {
        Compilation::getVoidType(local_10);
        local_8 = BumpAllocator::
                  emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Symbol_const&,slang::SourceRange&>
                            ((BumpAllocator *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             (Type *)local_10,
                             (Expression *)
                             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                             (Symbol *)in_stack_fffffffffffffc68,
                             (SourceRange *)in_stack_fffffffffffffc60);
      }
    }
    else {
      bVar1 = Symbol::isValue((Symbol *)0xf60108);
      if (bVar1) {
        Symbol::as<slang::ast::ValueSymbol>((Symbol *)0xf6011b);
        uVar6 = SUB84(local_10,0);
        uVar7 = (undefined4)((ulong)local_10 >> 0x20);
        ValueSymbol::getType((ValueSymbol *)0xf6013d);
        local_8 = BumpAllocator::
                  emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::ValueSymbol_const&,slang::SourceRange&>
                            ((BumpAllocator *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             (Type *)in_stack_fffffffffffffc78,(Expression *)CONCAT44(uVar7,uVar6),
                             (ValueSymbol *)in_stack_fffffffffffffc68,
                             (SourceRange *)in_stack_fffffffffffffc60);
      }
      else {
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc74,
                            in_stack_fffffffffffffc68);
        range_03.endLoc = in_stack_fffffffffffffc60;
        range_03.startLoc = in_stack_fffffffffffffc58;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc50,range_03);
        range_04.endLoc = in_stack_fffffffffffffc60;
        range_04.startLoc = in_stack_fffffffffffffc58;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc50,range_04);
        arg_00._M_str = (char *)in_stack_fffffffffffffca0;
        arg_00._M_len = (size_t)in_stack_fffffffffffffc98;
        Diagnostic::operator<<(in_stack_fffffffffffffc90,arg_00);
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0xf60288);
        ast::operator<<(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        local_8 = (MemberAccessExpression *)
                  Expression::badExpr(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      }
    }
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& MemberAccessExpression::fromSelector(
    Compilation& compilation, Expression& expr, const LookupResult::MemberSelector& selector,
    const InvocationExpressionSyntax* invocation,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, const ASTContext& context,
    bool isFromLookupChain) {

    // If the selector name is invalid just give up early.
    if (selector.name.empty())
        return badExpr(compilation, &expr);

    // The source range of the entire member access starts from the value being selected.
    SourceRange range{expr.sourceRange.start(), selector.nameRange.end()};

    // Special cases for built-in iterator methods that don't cleanly fit the general
    // mold of looking up members via the type of the expression.
    if (expr.kind == ExpressionKind::NamedValue) {
        auto& sym = expr.as<NamedValueExpression>().symbol;
        auto symKind = sym.kind;
        if (symKind == SymbolKind::Iterator) {
            auto& iter = sym.as<IteratorSymbol>();
            if (iter.indexMethodName == selector.name) {
                auto result = CallExpression::fromBuiltInMethod(compilation, symKind, expr,
                                                                "index"sv, invocation, withClause,
                                                                context);
                if (result)
                    return *result;
            }
        }
    }
    else if (expr.kind == ExpressionKind::Call && isFromLookupChain) {
        // It's an error to dot select from a call expression that
        // doesn't include parentheses, which it doesn't iff
        // isFromLookupChain is set.
        context.addDiag(diag::ChainedMethodParens, range);
    }

    auto errorIfNotProcedural = [&] {
        if (context.flags.has(ASTFlags::NonProcedural)) {
            context.addDiag(diag::DynamicNotProcedural, range);
            return true;
        }
        return false;
    };
    auto errorIfAssertion = [&] {
        if (context.flags.has(ASTFlags::AssertionExpr)) {
            context.addDiag(diag::ClassMemberInAssertion, range);
            return true;
        }
        return false;
    };

    // This might look like a member access but actually be a built-in type method.
    const Type& type = expr.type->getCanonicalType();
    const Scope* scope = nullptr;
    switch (type.kind) {
        case SymbolKind::PackedStructType:
        case SymbolKind::UnpackedStructType:
        case SymbolKind::PackedUnionType:
        case SymbolKind::UnpackedUnionType:
            scope = &type.as<Scope>();
            break;
        case SymbolKind::ClassType: {
            auto& ct = type.as<ClassType>();
            if (auto base = ct.getBaseClass(); base && base->isError())
                return badExpr(compilation, &expr);

            scope = &ct;
            break;
        }
        case SymbolKind::CovergroupType:
            scope = &type.as<CovergroupType>().getBody();
            break;
        case SymbolKind::EnumType:
        case SymbolKind::StringType:
        case SymbolKind::FixedSizeUnpackedArrayType:
        case SymbolKind::DynamicArrayType:
        case SymbolKind::AssociativeArrayType:
        case SymbolKind::QueueType:
        case SymbolKind::EventType:
        case SymbolKind::SequenceType: {
            if (auto result = tryBindSpecialMethod(compilation, expr, selector, invocation,
                                                   withClause, context)) {
                return *result;
            }

            return CallExpression::fromSystemMethod(compilation, expr, selector, invocation,
                                                    withClause, context);
        }
        case SymbolKind::ErrorType:
            return badExpr(compilation, &expr);
        case SymbolKind::VoidType:
            if (auto sym = expr.getSymbolReference()) {
                if (sym->kind == SymbolKind::Coverpoint) {
                    scope = &sym->as<CoverpointSymbol>();
                    break;
                }
                else if (sym->kind == SymbolKind::CoverCross) {
                    scope = &sym->as<CoverCrossSymbol>();
                    break;
                }
            }
            [[fallthrough]];
        default: {
            if (auto result = tryBindSpecialMethod(compilation, expr, selector, invocation,
                                                   withClause, context)) {
                return *result;
            }

            auto& diag = context.addDiag(diag::InvalidMemberAccess, selector.dotLocation);
            diag << expr.sourceRange;
            diag << selector.nameRange;
            diag << *expr.type;
            return badExpr(compilation, &expr);
        }
    }

    const Symbol* member = scope->find(selector.name);
    if (!member) {
        if (auto result = tryBindSpecialMethod(compilation, expr, selector, invocation, withClause,
                                               context)) {
            return *result;
        }

        auto& diag = context.addDiag(diag::UnknownMember, selector.nameRange.start());
        diag << expr.sourceRange;
        diag << selector.name;
        diag << *expr.type;
        return badExpr(compilation, &expr);
    }

    switch (member->kind) {
        case SymbolKind::Field: {
            auto& field = member->as<FieldSymbol>();
            return *compilation.emplace<MemberAccessExpression>(field.getType(), expr, field,
                                                                range);
        }
        case SymbolKind::ClassProperty: {
            Lookup::ensureVisible(*member, context, selector.nameRange);
            auto& prop = member->as<ClassPropertySymbol>();
            if (prop.lifetime == VariableLifetime::Automatic &&
                (errorIfNotProcedural() || errorIfAssertion())) {
                return badExpr(compilation, &expr);
            }

            return *compilation.emplace<MemberAccessExpression>(prop.getType(), expr, prop, range);
        }
        case SymbolKind::Subroutine: {
            Lookup::ensureVisible(*member, context, selector.nameRange);
            auto& sub = member->as<SubroutineSymbol>();
            if (!sub.flags.has(MethodFlags::Static) &&
                (errorIfNotProcedural() || errorIfAssertion())) {
                return badExpr(compilation, &expr);
            }

            return CallExpression::fromLookup(compilation, &sub, &expr, invocation, withClause,
                                              range, context);
        }
        case SymbolKind::ConstraintBlock:
        case SymbolKind::Coverpoint:
        case SymbolKind::CoverCross:
        case SymbolKind::CoverageBin: {
            if (errorIfNotProcedural())
                return badExpr(compilation, &expr);
            return *compilation.emplace<MemberAccessExpression>(compilation.getVoidType(), expr,
                                                                *member, range);
        }
        case SymbolKind::EnumValue:
            // The thing being selected from doesn't actually matter, since the
            // enum value is a constant.
            return ValueExpressionBase::fromSymbol(context, *member, nullptr, range);
        default: {
            if (member->isValue()) {
                auto& value = member->as<ValueSymbol>();
                return *compilation.emplace<MemberAccessExpression>(value.getType(), expr, value,
                                                                    range);
            }

            auto& diag = context.addDiag(diag::InvalidClassAccess, selector.dotLocation);
            diag << selector.nameRange;
            diag << expr.sourceRange;
            diag << selector.name;
            diag << *expr.type;
            return badExpr(compilation, &expr);
        }
    }
}